

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool maxValueScaleMatrix(HighsOptions *options,HighsLp *lp,HighsInt use_scale_strategy)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  double *pdVar4;
  int *in_RSI;
  long in_RDI;
  double dVar5;
  char *format;
  HighsLogOptions *log_options_;
  HighsInt iRow_3;
  HighsInt k_3;
  HighsInt iCol_2;
  bool poor_improvement;
  double improvement_factor_required;
  double improvement_factor;
  double matrix_value_ratio_improvement;
  double original_matrix_value_ratio;
  double matrix_value_ratio;
  double value_2;
  HighsInt k_2;
  double col_scale_value;
  double value_1;
  HighsInt iRow_2;
  HighsInt k_1;
  double col_max_value;
  HighsInt iCol_1;
  double matrix_max_value;
  double matrix_min_value;
  double max_col_scale;
  double min_col_scale;
  double row_scale_value;
  HighsInt iRow_1;
  double value;
  HighsInt iRow;
  HighsInt k;
  HighsInt iCol;
  vector<double,_std::allocator<double>_> row_max_value;
  double original_matrix_max_value;
  double original_matrix_min_value;
  double max_row_scale;
  double min_row_scale;
  double max_allow_row_scale;
  double min_allow_row_scale;
  double max_allow_col_scale;
  double min_allow_col_scale;
  double min_allow_scale;
  double max_allow_scale;
  double log2;
  vector<double,_std::allocator<double>_> *Avalue;
  vector<int,_std::allocator<int>_> *Aindex;
  vector<int,_std::allocator<int>_> *Astart;
  vector<double,_std::allocator<double>_> *rowScale;
  vector<double,_std::allocator<double>_> *colScale;
  HighsScale *scale;
  HighsInt numRow;
  HighsInt numCol;
  allocator_type *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  size_type in_stack_fffffffffffffd98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffda0;
  value_type vVar6;
  int local_194;
  int local_190;
  value_type local_160;
  int local_154;
  double local_150;
  value_type local_148;
  int local_140;
  int local_13c;
  double local_138;
  int local_12c;
  double local_128;
  HighsLogOptions *local_120;
  double local_118;
  HighsLogOptions *local_110;
  double local_108;
  int local_fc;
  undefined4 local_f8;
  uint uStack_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  undefined8 local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  double local_b0;
  double local_a8;
  double local_a0;
  char *local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  int *local_30;
  int local_24;
  int local_20;
  long local_10;
  byte local_1;
  
  local_20 = *in_RSI;
  local_24 = in_RSI[1];
  local_30 = in_RSI + 0x82;
  local_38 = (vector<double,_std::allocator<double>_> *)(in_RSI + 0x88);
  local_40 = (vector<double,_std::allocator<double>_> *)(in_RSI + 0x8e);
  local_48 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x24);
  local_50 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x30);
  local_58 = (vector<double,_std::allocator<double>_> *)(in_RSI + 0x36);
  local_10 = in_RDI;
  local_60 = log(2.0);
  local_90 = pow(2.0,(double)*(int *)(local_10 + 0x21c));
  local_88 = 1.0 / local_90;
  local_98 = (char *)0x7ff0000000000000;
  local_a0 = 0.0;
  local_a8 = INFINITY;
  local_b0 = 0.0;
  local_d0 = 0;
  local_80 = local_90;
  local_78 = local_88;
  local_70 = local_88;
  local_68 = local_90;
  std::allocator<double>::allocator((allocator<double> *)0x4fbd03);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88);
  std::allocator<double>::~allocator((allocator<double> *)0x4fbd37);
  for (local_e8 = 0; local_e8 < local_20; local_e8 = local_e8 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_e8);
    for (local_ec = *pvVar2; iVar1 = local_ec,
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)(local_e8 + 1)),
        iVar1 < *pvVar2; local_ec = local_ec + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_ec);
      local_f0 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_ec);
      local_f8 = *(undefined4 *)pvVar3;
      uStack_f4 = *(uint *)((long)pvVar3 + 4) & 0x7fffffff;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)local_f0);
      pdVar4 = std::max<double>(pvVar3,(double *)&local_f8);
      dVar5 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)local_f0);
      *pvVar3 = dVar5;
      pdVar4 = std::min<double>(&local_a8,(double *)&local_f8);
      local_a8 = *pdVar4;
      pdVar4 = std::max<double>(&local_b0,(double *)&local_f8);
      local_b0 = *pdVar4;
    }
  }
  for (local_fc = 0; local_fc < local_24; local_fc = local_fc + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)local_fc);
    if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)local_fc);
      local_108 = 1.0 / *pvVar3;
      dVar5 = log(local_108);
      dVar5 = floor(dVar5 / local_60 + 0.5);
      local_108 = pow(2.0,dVar5);
      pdVar4 = std::max<double>(&local_88,&local_108);
      pdVar4 = std::min<double>(pdVar4,&local_90);
      local_108 = *pdVar4;
      pdVar4 = std::min<double>(&local_108,(double *)&local_98);
      local_98 = (char *)*pdVar4;
      pdVar4 = std::max<double>(&local_108,&local_a0);
      dVar5 = local_108;
      local_a0 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_fc);
      *pvVar3 = dVar5;
    }
  }
  local_110 = (HighsLogOptions *)0x7ff0000000000000;
  local_118 = 0.0;
  local_120 = (HighsLogOptions *)0x7ff0000000000000;
  local_128 = 0.0;
  for (local_12c = 0; local_12c < local_20; local_12c = local_12c + 1) {
    local_138 = 0.0;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_12c);
    for (local_13c = *pvVar2; iVar1 = local_13c,
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)(local_12c + 1)),
        iVar1 < *pvVar2; local_13c = local_13c + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_13c);
      local_140 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_140);
      dVar5 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_13c);
      *pvVar3 = *pvVar3 * dVar5;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_13c);
      local_148 = ABS(*pvVar3);
      pdVar4 = std::max<double>(&local_138,&local_148);
      local_138 = *pdVar4;
    }
    if ((local_138 != 0.0) || (NAN(local_138))) {
      local_150 = 1.0 / local_138;
      dVar5 = log(local_150);
      dVar5 = floor(dVar5 / local_60 + 0.5);
      local_150 = pow(2.0,dVar5);
      pdVar4 = std::max<double>(&local_78,&local_150);
      pdVar4 = std::min<double>(pdVar4,&local_80);
      local_150 = *pdVar4;
      pdVar4 = std::min<double>(&local_150,(double *)&local_110);
      local_110 = (HighsLogOptions *)*pdVar4;
      pdVar4 = std::max<double>(&local_150,&local_118);
      dVar5 = local_150;
      local_118 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_12c);
      *pvVar3 = dVar5;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_12c);
      for (local_154 = *pvVar2; iVar1 = local_154,
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (local_48,(long)(local_12c + 1)), iVar1 < *pvVar2;
          local_154 = local_154 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_12c);
        vVar6 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_154);
        *pvVar3 = *pvVar3 * vVar6;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_154);
        local_160 = ABS(*pvVar3);
        pdVar4 = std::min<double>((double *)&local_120,&local_160);
        local_120 = (HighsLogOptions *)*pdVar4;
        pdVar4 = std::max<double>(&local_128,&local_160);
        local_128 = *pdVar4;
      }
    }
  }
  format = (char *)(local_128 / (double)local_120);
  dVar5 = local_b0 / local_a8;
  log_options_ = (HighsLogOptions *)(dVar5 / (double)format);
  if (1.0 < (double)log_options_) {
    if (*(int *)(local_10 + 0x208) != 0) {
      highsLogDev(local_110,SUB84(local_118,0),local_98,local_a0,local_10 + 0x380,1,
                  "Scaling: Factors are in [%0.4g, %0.4g] for columns and in [%0.4g, %0.4g] for rows\n"
                 );
      highsLogDev(local_120,SUB84(local_128,0),format,local_a8,local_b0,dVar5,log_options_,
                  local_10 + 0x380,1,
                  "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, %0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n"
                 );
    }
    local_1 = 1;
  }
  else {
    for (local_190 = 0; local_190 < local_20; local_190 = local_190 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_190);
      local_194 = *pvVar2;
      while (in_stack_fffffffffffffd94 = local_194,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (local_48,(long)(local_190 + 1)), in_stack_fffffffffffffd94 < *pvVar2
            ) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_194);
        iVar1 = *pvVar2;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_190);
        dVar5 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)iVar1);
        dVar5 = dVar5 * *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_194);
        *pvVar3 = *pvVar3 / dVar5;
        local_194 = local_194 + 1;
      }
    }
    if (*(int *)(local_10 + 0x208) != 0) {
      highsLogDev(log_options_,0,(char *)(local_10 + 0x380),1,
                  "Scaling: Improvement factor %0.4g < %0.4g required, so no scaling applied\n");
    }
    local_1 = 0;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  return (bool)(local_1 & 1);
}

Assistant:

bool maxValueScaleMatrix(const HighsOptions& options, HighsLp& lp,
                         const HighsInt use_scale_strategy) {
  HighsInt numCol = lp.num_col_;
  HighsInt numRow = lp.num_row_;
  HighsScale& scale = lp.scale_;
  vector<double>& colScale = scale.col;
  vector<double>& rowScale = scale.row;
  vector<HighsInt>& Astart = lp.a_matrix_.start_;
  vector<HighsInt>& Aindex = lp.a_matrix_.index_;
  vector<double>& Avalue = lp.a_matrix_.value_;

  assert(options.simplex_scale_strategy == kSimplexScaleStrategyMaxValue015 ||
         options.simplex_scale_strategy == kSimplexScaleStrategyMaxValue0157);

  // The 015(7) values refer to bit settings in FICO's scaling options.
  // Specifically
  //
  // 0: Row scaling
  //
  // 1: Column scaling
  //
  // 5: Scale by maximum element
  //
  // 7: Scale objective function for the simplex method
  //
  // Note that 7 is not yet implemented, so
  // kSimplexScaleStrategyMaxValue015 and
  // kSimplexScaleStrategyMaxValue0157 are equivalent. However, cost
  // scaling could be well worth adding, now that the unscaled problem
  // can be solved using scaled NLA

  const double log2 = log(2.0);
  const double max_allow_scale = pow(2.0, options.allowed_matrix_scale_factor);
  const double min_allow_scale = 1 / max_allow_scale;

  const double min_allow_col_scale = min_allow_scale;
  const double max_allow_col_scale = max_allow_scale;
  const double min_allow_row_scale = min_allow_scale;
  const double max_allow_row_scale = max_allow_scale;

  double min_row_scale = kHighsInf;
  double max_row_scale = 0;
  double original_matrix_min_value = kHighsInf;
  double original_matrix_max_value = 0;
  // Determine the row scaling. Also determine the max/min row scaling
  // factors, and max/min original matrix values
  vector<double> row_max_value(numRow, 0);
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      const HighsInt iRow = Aindex[k];
      const double value = fabs(Avalue[k]);
      row_max_value[iRow] = max(row_max_value[iRow], value);
      original_matrix_min_value = min(original_matrix_min_value, value);
      original_matrix_max_value = max(original_matrix_max_value, value);
    }
  }
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    if (row_max_value[iRow]) {
      double row_scale_value = 1 / row_max_value[iRow];
      // Convert the row scale factor to the nearest power of two, and
      // ensure that it is not excessively large or small
      row_scale_value = pow(2.0, floor(log(row_scale_value) / log2 + 0.5));
      row_scale_value =
          min(max(min_allow_row_scale, row_scale_value), max_allow_row_scale);
      min_row_scale = min(row_scale_value, min_row_scale);
      max_row_scale = max(row_scale_value, max_row_scale);
      rowScale[iRow] = row_scale_value;
    }
  }
  // Determine the column scaling, whilst applying the row scaling
  // Also determine the max/min column scaling factors, and max/min
  // matrix values
  double min_col_scale = kHighsInf;
  double max_col_scale = 0;
  double matrix_min_value = kHighsInf;
  double matrix_max_value = 0;
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    double col_max_value = 0;
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      const HighsInt iRow = Aindex[k];
      Avalue[k] *= rowScale[iRow];
      const double value = fabs(Avalue[k]);
      col_max_value = max(col_max_value, value);
    }
    if (col_max_value) {
      double col_scale_value = 1 / col_max_value;
      // Convert the col scale factor to the nearest power of two, and
      // ensure that it is not excessively large or small
      col_scale_value = pow(2.0, floor(log(col_scale_value) / log2 + 0.5));
      col_scale_value =
          min(max(min_allow_col_scale, col_scale_value), max_allow_col_scale);
      min_col_scale = min(col_scale_value, min_col_scale);
      max_col_scale = max(col_scale_value, max_col_scale);
      colScale[iCol] = col_scale_value;
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        Avalue[k] *= colScale[iCol];
        const double value = fabs(Avalue[k]);
        matrix_min_value = min(matrix_min_value, value);
        matrix_max_value = max(matrix_max_value, value);
      }
    }
  }
  const double matrix_value_ratio = matrix_max_value / matrix_min_value;
  const double original_matrix_value_ratio =
      original_matrix_max_value / original_matrix_min_value;
  const double matrix_value_ratio_improvement =
      original_matrix_value_ratio / matrix_value_ratio;

  const double improvement_factor = matrix_value_ratio_improvement;

  const double improvement_factor_required = 1.0;
  const bool poor_improvement =
      improvement_factor <= improvement_factor_required;

  if (poor_improvement) {
    // Unscale the matrix
    for (HighsInt iCol = 0; iCol < numCol; iCol++) {
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        HighsInt iRow = Aindex[k];
        Avalue[k] /= (colScale[iCol] * rowScale[iRow]);
      }
    }
    if (options.log_dev_level)
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Improvement factor %0.4g < %0.4g required, so no "
                  "scaling applied\n",
                  improvement_factor, improvement_factor_required);
    return false;
  } else {
    if (options.log_dev_level) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Factors are in [%0.4g, %0.4g] for columns and in "
                  "[%0.4g, %0.4g] for rows\n",
                  min_col_scale, max_col_scale, min_row_scale, max_row_scale);
      highsLogDev(
          options.log_options, HighsLogType::kInfo,
          "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, "
          "%0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n",
          matrix_min_value, matrix_max_value, matrix_value_ratio,
          original_matrix_min_value, original_matrix_max_value,
          original_matrix_value_ratio, matrix_value_ratio_improvement);
    }
    return true;
  }
}